

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O3

bool __thiscall AllDiffDomain<4>::check(AllDiffDomain<4> *this)

{
  uint uVar1;
  int iVar2;
  IntView<4> *pIVar3;
  uint uVar4;
  void *__s;
  long lVar5;
  ulong __n;
  byte bVar6;
  long lVar7;
  
  uVar1 = this->sz;
  __n = (ulong)uVar1;
  if (__n == 0) {
    bVar6 = 1;
  }
  else {
    uVar4 = 0xffffffff;
    if (-1 < (int)uVar1) {
      uVar4 = uVar1;
    }
    __s = operator_new__((long)(int)uVar4);
    if ((int)uVar1 < 1) {
      bVar6 = 1;
    }
    else {
      lVar7 = 0;
      memset(__s,0,__n);
      pIVar3 = this->x;
      do {
        lVar5 = *(long *)((long)&pIVar3->var + lVar7);
        iVar2 = *(int *)(lVar5 + 0xc + (ulong)*(byte *)(lVar5 + 0x20) * 0x10);
        lVar5 = (long)*(int *)((long)&pIVar3->b + lVar7);
        bVar6 = *(byte *)((long)__s + lVar5 + iVar2);
        if (bVar6 != 0) break;
        *(undefined1 *)((long)__s + lVar5 + iVar2) = 1;
        lVar7 = lVar7 + 0x10;
      } while (__n << 4 != lVar7);
      bVar6 = bVar6 ^ 1;
    }
    operator_delete__(__s);
  }
  return (bool)bVar6;
}

Assistant:

bool check() override {
		if (sz == 0) {
			return true;
		}
		bool* taken = new bool[sz];
		//		bool taken[sz];
		for (int i = 0; i < sz; i++) {
			taken[i] = false;
		}
		for (int i = 0; i < sz; i++) {
			if (taken[x[i].getShadowVal()]) {
				delete[] taken;
				return false;
			}
			taken[x[i].getShadowVal()] = true;
		}
		delete[] taken;
		return true;
	}